

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

jx9_hashmap_node *
HashmapNodeMerge(jx9_hashmap_node *pA,jx9_hashmap_node *pB,ProcNodeCmp xCmp,void *pCmpData)

{
  sxi32 sVar1;
  jx9_hashmap_node *local_90;
  jx9_hashmap_node *pTail;
  jx9_hashmap_node result;
  void *pCmpData_local;
  ProcNodeCmp xCmp_local;
  jx9_hashmap_node *pB_local;
  jx9_hashmap_node *pA_local;
  
  result.pNext = (jx9_hashmap_node *)0x0;
  result.nValIdx = 0;
  result._60_4_ = 0;
  local_90 = (jx9_hashmap_node *)&pTail;
  result.pPrevCollide = (jx9_hashmap_node *)pCmpData;
  xCmp_local = (ProcNodeCmp)pB;
  pB_local = pA;
  while (pB_local != (jx9_hashmap_node *)0x0 && xCmp_local != (ProcNodeCmp)0x0) {
    sVar1 = (*xCmp)(pB_local,(jx9_hashmap_node *)xCmp_local,result.pPrevCollide);
    if (sVar1 < 0) {
      local_90->pPrev = pB_local;
      pB_local->pNext = local_90;
      local_90 = pB_local;
      pB_local = pB_local->pPrev;
    }
    else {
      local_90->pPrev = (jx9_hashmap_node *)xCmp_local;
      *(jx9_hashmap_node **)(xCmp_local + 0x40) = local_90;
      local_90 = (jx9_hashmap_node *)xCmp_local;
      xCmp_local = *(ProcNodeCmp *)(xCmp_local + 0x48);
    }
  }
  if (pB_local == (jx9_hashmap_node *)0x0) {
    if (xCmp_local == (ProcNodeCmp)0x0) {
      local_90->pNext = (jx9_hashmap_node *)0x0;
      local_90->pPrev = (jx9_hashmap_node *)0x0;
    }
    else {
      local_90->pPrev = (jx9_hashmap_node *)xCmp_local;
      *(jx9_hashmap_node **)(xCmp_local + 0x40) = local_90;
    }
  }
  else {
    local_90->pPrev = pB_local;
    pB_local->pNext = local_90;
  }
  return result.pNext;
}

Assistant:

static jx9_hashmap_node * HashmapNodeMerge(jx9_hashmap_node *pA, jx9_hashmap_node *pB, ProcNodeCmp xCmp, void *pCmpData)
{
	jx9_hashmap_node result, *pTail;
    /* Prevent compiler warning */
	result.pNext = result.pPrev = 0;
	pTail = &result;
	while( pA && pB ){
		if( xCmp(pA, pB, pCmpData) < 0 ){
			pTail->pPrev = pA;
			pA->pNext = pTail;
			pTail = pA;
			pA = pA->pPrev;
		}else{
			pTail->pPrev = pB;
			pB->pNext = pTail;
			pTail = pB;
			pB = pB->pPrev;
		}
	}
	if( pA ){
		pTail->pPrev = pA;
		pA->pNext = pTail;
	}else if( pB ){
		pTail->pPrev = pB;
		pB->pNext = pTail;
	}else{
		pTail->pPrev = pTail->pNext = 0;
	}
	return result.pPrev;
}